

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiTests.cpp
# Opt level: O0

void vkt::api::anon_unknown_1::createApiTests(TestCaseGroup *apiTests)

{
  TestContext *pTVar1;
  TestContext *this;
  TestNode *pTVar2;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  TestContext *local_18;
  TestContext *testCtx;
  TestCaseGroup *apiTests_local;
  
  testCtx = (TestContext *)apiTests;
  local_18 = tcu::TestNode::getTestContext(&apiTests->super_TestNode);
  pTVar1 = testCtx;
  pTVar2 = &createSmokeTests(local_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar1 = testCtx;
  pTVar2 = &createFeatureInfoTests(local_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar1 = testCtx;
  pTVar2 = &createDeviceInitializationTests(local_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar1 = testCtx;
  pTVar2 = &createObjectManagementTests(local_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar1 = testCtx;
  pTVar2 = &createBufferTests(local_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  this = testCtx;
  pTVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"buffer_view",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"BufferView tests",&local_71);
  pTVar2 = &createTestGroup(pTVar1,&local_38,&local_70,createBufferViewTests)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pTVar1 = testCtx;
  pTVar2 = &createCommandBuffersTests(local_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar1 = testCtx;
  pTVar2 = &createCopiesAndBlittingTests(local_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar1 = testCtx;
  pTVar2 = &createImageClearingTests(local_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar1 = testCtx;
  pTVar2 = &createFillAndUpdateBufferTests(local_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar1 = testCtx;
  pTVar2 = &createDescriptorPoolTests(local_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar1 = testCtx;
  pTVar2 = &createNullHandleTests(local_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar1 = testCtx;
  pTVar2 = &createGranularityQueryTests(local_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar1 = testCtx;
  pTVar2 = &createMemoryCommitmentTests(local_18)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  return;
}

Assistant:

void createApiTests (tcu::TestCaseGroup* apiTests)
{
	tcu::TestContext&	testCtx		= apiTests->getTestContext();

	apiTests->addChild(createSmokeTests					(testCtx));
	apiTests->addChild(api::createFeatureInfoTests		(testCtx));
	apiTests->addChild(createDeviceInitializationTests	(testCtx));
	apiTests->addChild(createObjectManagementTests		(testCtx));
	apiTests->addChild(createBufferTests				(testCtx));
	apiTests->addChild(createTestGroup					(testCtx, "buffer_view", "BufferView tests", createBufferViewTests));
	apiTests->addChild(createCommandBuffersTests		(testCtx));
	apiTests->addChild(createCopiesAndBlittingTests		(testCtx));
	apiTests->addChild(createImageClearingTests			(testCtx));
	apiTests->addChild(createFillAndUpdateBufferTests	(testCtx));
	apiTests->addChild(createDescriptorPoolTests		(testCtx));
	apiTests->addChild(createNullHandleTests			(testCtx));
	apiTests->addChild(createGranularityQueryTests		(testCtx));
	apiTests->addChild(createMemoryCommitmentTests		(testCtx));
}